

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryEffectsLoader14.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL::LibraryEffectsLoader14::data__wrap_t____fx_sampler_wrap_common
          (LibraryEffectsLoader14 *this,ENUM__fx_sampler_wrap_common value)

{
  int iVar1;
  ulong uVar2;
  
  uVar2 = 0;
  if (value - ENUM__fx_sampler_wrap_common__WRAP < 6) {
    uVar2 = (ulong)*(uint *)(&DAT_008617a0 + (ulong)(value - ENUM__fx_sampler_wrap_common__WRAP) * 4
                            );
  }
  iVar1 = (*(this->mLoader->super_LibraryImagesLoader).super_FilePartLoader.super_IFilePartLoader.
            super_ExtraDataLoader._vptr_ExtraDataLoader[0x32])(this->mLoader,uVar2);
  return SUB41(iVar1,0);
}

Assistant:

bool LibraryEffectsLoader14::data__wrap_t____fx_sampler_wrap_common( const COLLADASaxFWL14::ENUM__fx_sampler_wrap_common value )
{
SaxVirtualFunctionTest14(data__wrap_t____fx_sampler_wrap_common(value));
COLLADASaxFWL::ENUM__fx_sampler_wrap_common newValue;
switch (value) {
case COLLADASaxFWL14::ENUM__fx_sampler_wrap_common__NONE: newValue=COLLADASaxFWL::ENUM__fx_sampler_wrap_common__NONE; break;
case COLLADASaxFWL14::ENUM__fx_sampler_wrap_common__WRAP: newValue=COLLADASaxFWL::ENUM__fx_sampler_wrap_common__WRAP; break;
case COLLADASaxFWL14::ENUM__fx_sampler_wrap_common__MIRROR: newValue=COLLADASaxFWL::ENUM__fx_sampler_wrap_common__MIRROR; break;
case COLLADASaxFWL14::ENUM__fx_sampler_wrap_common__CLAMP: newValue=COLLADASaxFWL::ENUM__fx_sampler_wrap_common__CLAMP; break;
case COLLADASaxFWL14::ENUM__fx_sampler_wrap_common__BORDER: newValue=COLLADASaxFWL::ENUM__fx_sampler_wrap_common__BORDER; break;
case COLLADASaxFWL14::ENUM__fx_sampler_wrap_common__COUNT: newValue=COLLADASaxFWL::ENUM__fx_sampler_wrap_common__COUNT; break;
case COLLADASaxFWL14::ENUM__fx_sampler_wrap_common__NOT_PRESENT: newValue=COLLADASaxFWL::ENUM__fx_sampler_wrap_common__NOT_PRESENT; break;
}
return mLoader->data__wrap_t____fx_sampler_wrap_common(newValue);
}